

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

void __thiscall ThreadedImageSaver::enqueue(ThreadedImageSaver *this,Image *img,path *path)

{
  Image *in_RDX;
  path *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,in_RDI);
  std::
  vector<std::pair<Image,std::filesystem::__cxx11::path>,std::allocator<std::pair<Image,std::filesystem::__cxx11::path>>>
  ::emplace_back<Image,std::filesystem::__cxx11::path>(in_stack_ffffffffffffffd0,in_RDX,in_RSI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x133f77);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void ThreadedImageSaver::enqueue(Image img, fs::path path) {
	{
		std::lock_guard<std::mutex> l(mtx);
		images.emplace_back(std::move(img), std::move(path));
	}
	cv.notify_one();
}